

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigTable.c
# Opt level: O1

void Aig_TableInsert(Aig_Man_t *p,Aig_Obj_t *pObj)

{
  Aig_Obj_t *pAVar1;
  Aig_Obj_t **ppAVar2;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Aig_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0xb0,"void Aig_TableInsert(Aig_Man_t *, Aig_Obj_t *)");
  }
  pAVar1 = Aig_TableLookup(p,pObj);
  if (pAVar1 == (Aig_Obj_t *)0x0) {
    if (((char)pObj->Id == '\0') && (p->nTableSize * 2 < p->nObjs[6] + p->nObjs[5])) {
      Aig_TableResize(p);
    }
    ppAVar2 = Aig_TableFind(p,pObj);
    if (*ppAVar2 == (Aig_Obj_t *)0x0) {
      *ppAVar2 = pObj;
      return;
    }
    __assert_fail("*ppPlace == NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                  ,0xb5,"void Aig_TableInsert(Aig_Man_t *, Aig_Obj_t *)");
  }
  __assert_fail("Aig_TableLookup(p, pObj) == NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigTable.c"
                ,0xb1,"void Aig_TableInsert(Aig_Man_t *, Aig_Obj_t *)");
}

Assistant:

void Aig_TableInsert( Aig_Man_t * p, Aig_Obj_t * pObj )
{
    Aig_Obj_t ** ppPlace;
    assert( !Aig_IsComplement(pObj) );
    assert( Aig_TableLookup(p, pObj) == NULL );
    if ( (pObj->Id & 0xFF) == 0 && 2 * p->nTableSize < Aig_ManNodeNum(p) )
        Aig_TableResize( p );
    ppPlace = Aig_TableFind( p, pObj );
    assert( *ppPlace == NULL );
    *ppPlace = pObj;
}